

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::DeepTiledOutputFile::Data::Data(Data *this,int numThreads)

{
  _Rb_tree_header *p_Var1;
  pointer ppTVar2;
  pointer ppTVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  undefined1 in_R10B;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  value_type *__val;
  V2f local_38;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  Header::Header(&this->header,0x40,0x40,1.0,&local_38,1.0,INCREASING_Y,ZIP_COMPRESSION);
  (this->tileDesc).xSize = 0x20;
  (this->tileDesc).ySize = 0x20;
  (this->tileDesc).mode = ONE_LEVEL;
  (this->tileDesc).roundingMode = ROUND_DOWN;
  p_Var1 = &(this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->frameBuffer)._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Slice::Slice(&(this->frameBuffer)._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
               SUB81(p_Var1,0));
  this->numXTiles = (int *)0x0;
  this->numYTiles = (int *)0x0;
  TileOffsets::TileOffsets(&this->tileOffsets,ONE_LEVEL,0,0,(int *)0x0,(int *)0x0);
  p_Var1 = &(this->tileMap)._M_t._M_impl.super__Rb_tree_header;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tileBuffers).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->slices).
  super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->tileOffsetsPosition = 0;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nextTileToWrite).dx = 0;
  (this->nextTileToWrite).dy = 0;
  (this->nextTileToWrite).lx = 0;
  (this->nextTileToWrite).ly = 0;
  this->partNumber = -1;
  this->_streamData = (OutputStreamMutex *)0x0;
  uVar6 = 1;
  if (1 < numThreads * 2) {
    uVar6 = (ulong)(uint)(numThreads * 2);
  }
  this->_deleteStream = true;
  ppTVar2 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar3 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)ppTVar2 - (long)ppTVar3 >> 3;
  uVar5 = uVar6 - uVar8;
  if (uVar6 < uVar8 || uVar5 == 0) {
    if ((uVar6 < uVar8) && (ppTVar3 = ppTVar3 + uVar6, ppTVar2 != ppTVar3)) {
      (this->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar3;
    }
  }
  else if ((ulong)((long)(this->tileBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2 >> 3) <
           uVar5) {
    if ((uVar8 ^ 0xfffffffffffffff) < uVar5) {
      std::__throw_length_error("vector::_M_default_append");
    }
    uVar4 = uVar5;
    if (uVar5 < uVar8) {
      uVar4 = uVar8;
    }
    uVar7 = uVar4 + uVar8;
    if (0xffffffffffffffe < uVar7) {
      uVar7 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar4,uVar8)) {
      uVar7 = 0xfffffffffffffff;
    }
    if (uVar7 == 0) {
      ppTVar3 = (pointer)0x0;
    }
    else {
      ppTVar3 = (pointer)operator_new(uVar7 * 8);
    }
    ppTVar3[uVar8] = (TileBuffer *)0x0;
    if (uVar5 != 1) {
      memset(ppTVar3 + uVar8 + 1,0,uVar5 * 8 - 8);
    }
    ppTVar2 = (this->tileBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)(this->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2;
    if (0 < (long)__n) {
      memmove(ppTVar3,ppTVar2,__n);
    }
    if (ppTVar2 != (pointer)0x0) {
      operator_delete(ppTVar2,(long)(this->tileBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppTVar2);
    }
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start = ppTVar3;
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar3 + uVar6;
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppTVar3 + uVar7;
  }
  else {
    *ppTVar2 = (TileBuffer *)0x0;
    ppTVar3 = ppTVar2 + 1;
    if (uVar5 != 1) {
      memset(ppTVar3,0,uVar5 * 8 - 8);
      ppTVar3 = ppTVar2 + uVar5;
    }
    (this->tileBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar3;
  }
  ppTVar3 = (this->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->tileBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppTVar3) {
    uVar6 = 0;
    do {
      ppTVar3[uVar6] = (TileBuffer *)0x0;
      uVar6 = uVar6 + 1;
      ppTVar3 = (this->tileBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->tileBuffers).
                                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3 >> 3))
    ;
  }
  return;
}

Assistant:

DeepTiledOutputFile::Data::Data (int numThreads):
    numXTiles(0),
    numYTiles(0),
    tileOffsetsPosition (0),
    partNumber(-1),
    _streamData(NULL),
    _deleteStream(true)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
    for (size_t i = 0; i < tileBuffers.size(); i++)
        tileBuffers[i] = 0;
}